

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFileEncoding.cpp
# Opt level: O1

bool Assimp::STEP::StringToUTF8(string *s)

{
  ulong uVar1;
  ulong uVar2;
  char cVar3;
  ulong uVar4;
  pointer pcVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  uchar *result;
  uchar *result_00;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  byte bVar14;
  ulong uVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  ulong uVar19;
  uchar temp [5];
  unsigned_short *local_78;
  uchar local_35 [5];
  
  uVar19 = 0;
  do {
    uVar1 = uVar19 + 3;
    uVar2 = uVar19 + 4;
    do {
      uVar4 = s->_M_string_length;
      if (uVar4 <= uVar19) goto LAB_0071a29f;
      pcVar5 = (s->_M_dataplus)._M_p;
      if (pcVar5[uVar19] != '\\') goto LAB_0071a297;
      if (((uVar1 < uVar4) && (pcVar5[uVar19 + 1] == 'S')) && (pcVar5[uVar19 + 2] == '\\')) {
        bVar13 = pcVar5[uVar1];
        if ((char)bVar13 < '\0') {
          __assert_fail("(uint8_t)s[i+3] < 0x80",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/STEPParser/STEPFileEncoding.cpp"
                        ,0x12a,"bool Assimp::STEP::StringToUTF8(std::string &)");
        }
        pcVar5[uVar19] = bVar13 >> 6 | 0xc2;
        (s->_M_dataplus)._M_p[uVar19 + 1] = bVar13 & 0x3f | 0x80;
        std::__cxx11::string::erase((ulong)s,uVar19 + 2);
        uVar19 = uVar19 + 1;
        goto LAB_0071a297;
      }
      if (((uVar2 < uVar4) && (pcVar5[uVar19 + 1] == 'X')) && (pcVar5[uVar19 + 2] == '\\')) {
        cVar3 = pcVar5[uVar19 + 3];
        bVar13 = cVar3 - 0x30;
        if (9 < bVar13) {
          if ((byte)(cVar3 + 0x9fU) < 6) {
            bVar13 = cVar3 + 0xa9;
          }
          else {
            bVar13 = cVar3 - 0x37;
            if (5 < (byte)(cVar3 + 0xbfU)) {
              bVar13 = 0xff;
            }
          }
        }
        cVar3 = pcVar5[uVar19 + 4];
        bVar14 = cVar3 - 0x30;
        if (9 < bVar14) {
          if ((byte)(cVar3 + 0x9fU) < 6) {
            bVar14 = cVar3 + 0xa9;
          }
          else {
            bVar14 = cVar3 - 0x37;
            if (5 < (byte)(cVar3 + 0xbfU)) {
              bVar14 = 0xff;
            }
          }
        }
        bVar14 = bVar13 * '\x10' + bVar14;
        if (bVar14 < 0x20) goto LAB_0071a29f;
        utf8::append<unsigned_char*>((uint)mac_codetable[bVar14 - 0x20],local_35);
        std::__cxx11::string::erase((ulong)s,uVar19);
        std::__cxx11::string::replace((ulong)s,uVar19,(char *)0x0,(ulong)local_35);
        goto LAB_0071a297;
      }
      if (((uVar4 <= uVar1) || (pcVar5[uVar19 + 1] != 'X')) ||
         (cVar3 = pcVar5[uVar19 + 2], 9 < (byte)(cVar3 - 0x30U))) goto LAB_0071a297;
      if ((cVar3 != '4') && (cVar3 != '2')) goto LAB_0071a29f;
      if (pcVar5[uVar1] != '\\') goto LAB_0071a297;
      uVar15 = uVar4 - 3;
      uVar12 = uVar2;
      if (uVar2 < uVar15) {
        uVar11 = uVar2;
        do {
          if ((((pcVar5[uVar11] == '\\') && (pcVar5[uVar11 + 1] == 'X')) &&
              (pcVar5[uVar11 + 2] == '0')) && (uVar12 = uVar11, pcVar5[uVar11 + 3] == '\\')) break;
          lVar10 = uVar11 - uVar4;
          uVar11 = uVar11 + 1;
          uVar12 = uVar15;
        } while (lVar10 != -4);
      }
      iVar9 = 1;
      if (uVar12 != uVar15) {
        uVar15 = uVar12 - uVar2;
        if (uVar15 == 0) {
          std::__cxx11::string::erase((ulong)s,uVar19);
          iVar9 = 3;
        }
        else if (cVar3 == '4') {
          if ((uVar15 & 7) == 0) {
            uVar11 = uVar15 >> 3;
            local_78 = (unsigned_short *)operator_new__(uVar15 >> 1);
            if (uVar12 != uVar2) {
              lVar10 = 0;
              do {
                cVar3 = pcVar5[lVar10 * 8 + uVar2];
                bVar13 = cVar3 - 0x30;
                if (9 < bVar13) {
                  if ((byte)(cVar3 + 0x9fU) < 6) {
                    bVar13 = cVar3 + 0xa9;
                  }
                  else {
                    bVar13 = cVar3 - 0x37;
                    if (5 < (byte)(cVar3 + 0xbfU)) {
                      bVar13 = 0xff;
                    }
                  }
                }
                cVar3 = pcVar5[lVar10 * 8 + uVar19 + 5];
                bVar14 = cVar3 - 0x30;
                if (9 < bVar14) {
                  if ((byte)(cVar3 + 0x9fU) < 6) {
                    bVar14 = cVar3 + 0xa9;
                  }
                  else {
                    bVar14 = cVar3 - 0x37;
                    if (5 < (byte)(cVar3 + 0xbfU)) {
                      bVar14 = 0xff;
                    }
                  }
                }
                cVar3 = pcVar5[lVar10 * 8 + uVar19 + 6];
                bVar16 = cVar3 - 0x30;
                if (9 < bVar16) {
                  if ((byte)(cVar3 + 0x9fU) < 6) {
                    bVar16 = cVar3 + 0xa9;
                  }
                  else {
                    bVar16 = cVar3 - 0x37;
                    if (5 < (byte)(cVar3 + 0xbfU)) {
                      bVar16 = 0xff;
                    }
                  }
                }
                cVar3 = pcVar5[lVar10 * 8 + uVar19 + 7];
                bVar17 = cVar3 - 0x30;
                if (9 < bVar17) {
                  if ((byte)(cVar3 + 0x9fU) < 6) {
                    bVar17 = cVar3 + 0xa9;
                  }
                  else {
                    bVar17 = cVar3 - 0x37;
                    if (5 < (byte)(cVar3 + 0xbfU)) {
                      bVar17 = 0xff;
                    }
                  }
                }
                cVar3 = pcVar5[lVar10 * 8 + uVar19 + 8];
                bVar6 = cVar3 - 0x30;
                if (9 < bVar6) {
                  if ((byte)(cVar3 + 0x9fU) < 6) {
                    bVar6 = cVar3 + 0xa9;
                  }
                  else {
                    bVar6 = cVar3 - 0x37;
                    if (5 < (byte)(cVar3 + 0xbfU)) {
                      bVar6 = 0xff;
                    }
                  }
                }
                cVar3 = pcVar5[lVar10 * 8 + uVar19 + 9];
                bVar7 = cVar3 - 0x30;
                if (9 < bVar7) {
                  if ((byte)(cVar3 + 0x9fU) < 6) {
                    bVar7 = cVar3 + 0xa9;
                  }
                  else {
                    bVar7 = cVar3 - 0x37;
                    if (5 < (byte)(cVar3 + 0xbfU)) {
                      bVar7 = 0xff;
                    }
                  }
                }
                cVar3 = pcVar5[lVar10 * 8 + uVar19 + 10];
                bVar8 = cVar3 - 0x30;
                if (9 < bVar8) {
                  if ((byte)(cVar3 + 0x9fU) < 6) {
                    bVar8 = cVar3 + 0xa9;
                  }
                  else {
                    bVar8 = cVar3 - 0x37;
                    if (5 < (byte)(cVar3 + 0xbfU)) {
                      bVar8 = 0xff;
                    }
                  }
                }
                cVar3 = pcVar5[lVar10 * 8 + uVar19 + 0xb];
                bVar18 = cVar3 - 0x30;
                if (9 < bVar18) {
                  if ((byte)(cVar3 + 0x9fU) < 6) {
                    bVar18 = cVar3 + 0xa9;
                  }
                  else {
                    bVar18 = cVar3 - 0x37;
                    if (5 < (byte)(cVar3 + 0xbfU)) {
                      bVar18 = 0xff;
                    }
                  }
                }
                *(uint *)(local_78 + lVar10 * 2) =
                     (uint)(byte)(bVar8 * '\x10' + bVar18) |
                     (uint)(byte)(bVar7 + bVar6 * '\x10') << 8 |
                     (uint)(byte)(bVar17 + bVar16 * '\x10') << 0x10 |
                     (uint)(byte)(bVar14 + bVar13 * '\x10') << 0x18;
                lVar10 = lVar10 + 1;
              } while (uVar11 + (uVar11 == 0) != lVar10);
            }
            result = (uchar *)operator_new__(uVar11 * 5);
            if (uVar12 != uVar2) {
              lVar10 = 0;
              result_00 = result;
              do {
                result_00 = utf8::append<unsigned_char*>
                                      (*(uint32_t *)((long)local_78 + lVar10),result_00);
                lVar10 = lVar10 + 4;
              } while (uVar11 << 2 != lVar10);
            }
            std::__cxx11::string::erase((ulong)s,uVar19);
            std::__cxx11::string::replace((ulong)s,uVar19,(char *)0x0,(ulong)result);
            goto LAB_0071a16c;
          }
        }
        else {
          iVar9 = 0;
          if ((cVar3 == '2') && (iVar9 = 1, (uVar15 & 3) == 0)) {
            uVar11 = uVar15 >> 2;
            local_78 = (unsigned_short *)operator_new__(uVar15 >> 1);
            if (uVar12 != uVar2) {
              lVar10 = 0;
              do {
                cVar3 = pcVar5[lVar10 * 4 + uVar2];
                bVar13 = cVar3 - 0x30;
                if (9 < bVar13) {
                  if ((byte)(cVar3 + 0x9fU) < 6) {
                    bVar13 = cVar3 + 0xa9;
                  }
                  else {
                    bVar13 = cVar3 - 0x37;
                    if (5 < (byte)(cVar3 + 0xbfU)) {
                      bVar13 = 0xff;
                    }
                  }
                }
                cVar3 = pcVar5[lVar10 * 4 + uVar19 + 5];
                bVar14 = cVar3 - 0x30;
                if (9 < bVar14) {
                  if ((byte)(cVar3 + 0x9fU) < 6) {
                    bVar14 = cVar3 + 0xa9;
                  }
                  else {
                    bVar14 = cVar3 - 0x37;
                    if (5 < (byte)(cVar3 + 0xbfU)) {
                      bVar14 = 0xff;
                    }
                  }
                }
                cVar3 = pcVar5[lVar10 * 4 + uVar19 + 6];
                bVar16 = cVar3 - 0x30;
                if (9 < bVar16) {
                  if ((byte)(cVar3 + 0x9fU) < 6) {
                    bVar16 = cVar3 + 0xa9;
                  }
                  else {
                    bVar16 = cVar3 - 0x37;
                    if (5 < (byte)(cVar3 + 0xbfU)) {
                      bVar16 = 0xff;
                    }
                  }
                }
                cVar3 = pcVar5[lVar10 * 4 + uVar19 + 7];
                bVar17 = cVar3 - 0x30;
                if (9 < bVar17) {
                  if ((byte)(cVar3 + 0x9fU) < 6) {
                    bVar17 = cVar3 + 0xa9;
                  }
                  else {
                    bVar17 = cVar3 - 0x37;
                    if (5 < (byte)(cVar3 + 0xbfU)) {
                      bVar17 = 0xff;
                    }
                  }
                }
                local_78[lVar10] = CONCAT11(bVar14 + bVar13 * '\x10',bVar16 * '\x10' + bVar17);
                lVar10 = lVar10 + 1;
              } while (uVar11 + (uVar11 == 0) != lVar10);
            }
            result = (uchar *)operator_new__(uVar11 * 3);
            utf8::utf16to8<unsigned_short_const*,unsigned_char*>(local_78,local_78 + uVar11,result);
            std::__cxx11::string::erase((ulong)s,uVar19);
            std::__cxx11::string::replace((ulong)s,uVar19,(char *)0x0,(ulong)result);
LAB_0071a16c:
            operator_delete__(result);
            operator_delete__(local_78);
            iVar9 = 3;
          }
        }
      }
    } while (iVar9 == 3);
    if (iVar9 != 0) {
LAB_0071a29f:
      return uVar4 <= uVar19;
    }
LAB_0071a297:
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

bool STEP::StringToUTF8(std::string& s)
{
    // very basic handling for escaped string sequences
    // http://doc.spatial.com/index.php?title=InterOp:Connect/STEP&redirect=no

    for (size_t i = 0; i < s.size(); ) {
        if (s[i] == '\\') {
            // \S\X - cp1252 (X is the character remapped to [0,127])
            if (i+3 < s.size() && s[i+1] == 'S' && s[i+2] == '\\') {
                // http://stackoverflow.com/questions/5586214/how-to-convert-char-from-iso-8859-1-to-utf-8-in-c-multiplatformly
                ai_assert((uint8_t)s[i+3] < 0x80);
                const uint8_t ch = s[i+3] + 0x80;

                s[i] = 0xc0 | (ch & 0xc0) >> 6;
                s[i+1] =  0x80 | (ch & 0x3f);

                s.erase(i + 2,2);
                ++i;
            }
            // \X\xx - mac/roman (xx is a hex sequence)
            else if (i+4 < s.size() && s[i+1] == 'X' && s[i+2] == '\\') {

                const uint8_t macval = HexOctetToDecimal(s.c_str() + i + 3);
                if(macval < 0x20) {
                    return false;
                }

                ai_assert(sizeof(mac_codetable) / sizeof(mac_codetable[0]) == 0x100-0x20);

                const uint32_t unival = mac_codetable[macval - 0x20], *univalp = &unival;

                unsigned char temp[5], *tempp = temp;
                ai_assert(sizeof( unsigned char ) == 1);

                utf8::utf32to8( univalp, univalp + 1, tempp );

                const size_t outcount = static_cast<size_t>(tempp-temp);

                s.erase(i,5);
                s.insert(i, reinterpret_cast<char*>(temp), outcount);
                i += outcount;
            }
            // \Xn\ .. \X0\ - various unicode encodings (n=2: utf16; n=4: utf32)
            else if (i+3 < s.size() && s[i+1] == 'X' && s[i+2] >= '0' && s[i+2] <= '9') {
                switch(s[i+2]) {
                    // utf16
                case '2':
                    // utf32
                case '4':
                    if (s[i+3] == '\\') {
                        const size_t basei = i+4;
                        size_t j = basei, jend = s.size()-3;

                        for (; j < jend; ++j) {
                            if (s[j] == '\\' && s[j+1] == 'X' && s[j+2] == '0' && s[j+3] == '\\') {
                                break;
                            }
                        }
                        if (j == jend) {
                            return false;
                        }

                        if (j == basei) {
                            s.erase(i,8);
                            continue;
                        }

                        if (s[i+2] == '2') {
                            if (((j - basei) % 4) != 0) {
                                return false;
                            }

                            const size_t count = (j-basei)/4;
                            std::unique_ptr<uint16_t[]> src(new uint16_t[count]);

                            const char* cur = s.c_str() + basei;
                            for (size_t k = 0; k < count; ++k, cur += 4) {
                                src[k] = (static_cast<uint16_t>(HexOctetToDecimal(cur)) << 8u)  |
                                     static_cast<uint16_t>(HexOctetToDecimal(cur+2));
                            }

                            const size_t dcount = count * 3; // this is enough to hold all possible outputs
                            std::unique_ptr<unsigned char[]> dest(new unsigned char[dcount]);

                            const uint16_t* srct = src.get();
                            unsigned char* destt = dest.get();
                            utf8::utf16to8( srct, srct + count, destt );

                            const size_t outcount = static_cast<size_t>(destt-dest.get());

                            s.erase(i,(j+4-i));

                            ai_assert(sizeof(unsigned char) == 1);
                            s.insert(i, reinterpret_cast<char*>(dest.get()), outcount);

                            i += outcount;
                            continue;
                        }
                        else if (s[i+2] == '4') {
                            if (((j - basei) % 8) != 0) {
                                return false;
                            }

                            const size_t count = (j-basei)/8;
                            std::unique_ptr<uint32_t[]> src(new uint32_t[count]);

                            const char* cur = s.c_str() + basei;
                            for (size_t k = 0; k < count; ++k, cur += 8) {
                                src[k] = (static_cast<uint32_t>(HexOctetToDecimal(cur  )) << 24u) |
                                         (static_cast<uint32_t>(HexOctetToDecimal(cur+2)) << 16u) |
                                         (static_cast<uint32_t>(HexOctetToDecimal(cur+4)) << 8u)  |
                                         (static_cast<uint32_t>(HexOctetToDecimal(cur+6)));
                            }

                            const size_t dcount = count * 5; // this is enough to hold all possible outputs
                            std::unique_ptr<unsigned char[]> dest(new unsigned char[dcount]);

                            const uint32_t* srct = src.get();
                            unsigned char* destt = dest.get();
                            utf8::utf32to8( srct, srct + count, destt );

                            const size_t outcount = static_cast<size_t>(destt-dest.get());

                            s.erase(i,(j+4-i));

                            ai_assert(sizeof(unsigned char) == 1);
                            s.insert(i, reinterpret_cast<char*>(dest.get()), outcount);

                            i += outcount;
                            continue;
                        }
                    }
                    break;

                    // TODO: other encoding patterns?

                default:
                    return false;
                }
            }
        }
        ++i;
    }
    return true;
}